

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::parseDuration(XMLDateTime *this)

{
  XMLCh XVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SchemaDateTimeException *pSVar7;
  XMLSize_t XVar8;
  double dVar9;
  XMLCh *local_50;
  int mlsec;
  int end;
  int endDate;
  bool designator;
  int negate;
  XMLCh c;
  XMLDateTime *this_local;
  
  bVar2 = initParser(this);
  if (!bVar2) {
    pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    if (this->fBuffer == (XMLCh *)0x0) {
      local_50 = L"";
    }
    else {
      local_50 = this->fBuffer;
    }
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x36e,DateTime_dur_invalid,local_50,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  XVar8 = this->fStart;
  this->fStart = XVar8 + 1;
  XVar1 = this->fBuffer[XVar8];
  if ((XVar1 != L'P') && (XVar1 != L'-')) {
    pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x379,DateTime_dur_Start_dashP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  if ((XVar1 == L'-') &&
     (XVar8 = this->fStart, this->fStart = XVar8 + 1, this->fBuffer[XVar8] != L'P')) {
    pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,899,DateTime_dur_noP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  iVar3 = 1;
  if (*this->fBuffer == L'-') {
    iVar3 = 3;
  }
  this->fValue[7] = iVar3;
  iVar3 = 1;
  if (*this->fBuffer == L'-') {
    iVar3 = -1;
  }
  iVar4 = indexOf(this,this->fStart,this->fEnd,L'-');
  if (iVar4 == -1) {
    mlsec = indexOf(this,this->fStart,this->fEnd,L'T');
    if (mlsec == -1) {
      mlsec = (int)this->fEnd;
    }
    iVar4 = indexOf(this,this->fStart,(long)mlsec,L'Y');
    if (iVar4 != -1) {
      iVar5 = parseInt(this,this->fStart,(long)iVar4);
      this->fValue[0] = iVar3 * iVar5;
      this->fStart = (long)(iVar4 + 1);
    }
    iVar5 = indexOf(this,this->fStart,(long)mlsec,L'M');
    if (iVar5 != -1) {
      iVar6 = parseInt(this,this->fStart,(long)iVar5);
      this->fValue[1] = iVar3 * iVar6;
      this->fStart = (long)(iVar5 + 1);
    }
    end._3_1_ = iVar5 != -1 || iVar4 != -1;
    iVar4 = indexOf(this,this->fStart,(long)mlsec,L'D');
    if (iVar4 != -1) {
      iVar5 = parseInt(this,this->fStart,(long)iVar4);
      this->fValue[2] = iVar3 * iVar5;
      this->fStart = (long)(iVar4 + 1);
      end._3_1_ = true;
    }
    if ((this->fEnd == (long)mlsec) && (this->fStart != this->fEnd)) {
      pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (pSVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x3c5,DateTime_dur_inv_b4T,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
                  SchemaDateTimeException::~SchemaDateTimeException);
    }
    if (this->fEnd != (long)mlsec) {
      XVar8 = this->fStart + 1;
      this->fStart = XVar8;
      iVar4 = indexOf(this,XVar8,this->fEnd,L'H');
      if (iVar4 != -1) {
        iVar5 = parseInt(this,this->fStart,(long)iVar4);
        this->fValue[3] = iVar3 * iVar5;
        this->fStart = (long)(iVar4 + 1);
        end._3_1_ = true;
      }
      iVar4 = indexOf(this,this->fStart,this->fEnd,L'M');
      if (iVar4 != -1) {
        iVar5 = parseInt(this,this->fStart,(long)iVar4);
        this->fValue[4] = iVar3 * iVar5;
        this->fStart = (long)(iVar4 + 1);
        end._3_1_ = true;
      }
      iVar4 = indexOf(this,this->fStart,this->fEnd,L'S');
      if (iVar4 != -1) {
        iVar5 = indexOf(this,this->fStart,(long)iVar4,L'.');
        if (iVar5 == -1) {
          iVar5 = parseInt(this,this->fStart,(long)iVar4);
          this->fValue[5] = iVar3 * iVar5;
        }
        else {
          if (iVar5 + 1 == iVar4) {
            pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
            SchemaDateTimeException::SchemaDateTimeException
                      (pSVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                       ,0x3f6,DateTime_dur_inv_seconds,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
                        SchemaDateTimeException::~SchemaDateTimeException);
          }
          iVar6 = parseInt(this,this->fStart,(long)iVar5);
          this->fValue[5] = iVar3 * iVar6;
          dVar9 = parseMiliSecond(this,(long)(iVar5 + 1),(long)iVar4);
          this->fMilliSecond = (double)iVar3 * dVar9;
        }
        this->fStart = (long)(iVar4 + 1);
        end._3_1_ = true;
      }
      if ((this->fStart != this->fEnd) ||
         (XVar8 = this->fStart, this->fStart = XVar8 - 1, this->fBuffer[XVar8 - 1] == L'T')) {
        pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
        SchemaDateTimeException::SchemaDateTimeException
                  (pSVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                   ,0x40d,DateTime_dur_NoTimeAfterT,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
                    SchemaDateTimeException::~SchemaDateTimeException);
      }
    }
    if (end._3_1_) {
      return;
    }
    pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x416,DateTime_dur_NoElementAtAll,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  pSVar7 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
  SchemaDateTimeException::SchemaDateTimeException
            (pSVar7,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
             ,0x397,DateTime_dur_DashNotFirst,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
             this->fMemoryManager);
  __cxa_throw(pSVar7,&SchemaDateTimeException::typeinfo,
              SchemaDateTimeException::~SchemaDateTimeException);
}

Assistant:

void XMLDateTime::parseDuration()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    // must start with '-' or 'P'
    //
    XMLCh c = fBuffer[fStart++];
    if ( (c != DURATION_STARTER) &&
         (c != chDash)            )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_Start_dashP
                , fBuffer
                , fMemoryManager);
    }

    // 'P' must ALWAYS be present in either case
    if ( (c == chDash) &&
         (fBuffer[fStart++]!= DURATION_STARTER ))
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_noP
                , fBuffer
                , fMemoryManager);
    }

    // java code
    //date[utc]=(c=='-')?'-':0;
    //fValue[utc] = UTC_STD;
    fValue[utc] = (fBuffer[0] == chDash? UTC_NEG : UTC_STD);

    int negate = ( fBuffer[0] == chDash ? -1 : 1);

    //
    // No negative value is allowed after 'P'
    //
    // eg P-1234, invalid
    //
    if (indexOf(fStart, fEnd, chDash) != NOT_FOUND)
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_DashNotFirst
                , fBuffer
                , fMemoryManager);
    }

    //at least one number and designator must be seen after P
    bool designator = false;

    int endDate = indexOf(fStart, fEnd, DATETIME_SEPARATOR);
    if ( endDate == NOT_FOUND )
    {
        endDate = (int)fEnd;  // 'T' absent
    }

    //find 'Y'
    int end = indexOf(fStart, endDate, DURATION_Y);
    if ( end != NOT_FOUND )
    {
        //scan year
        fValue[CentYear] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_M);
    if ( end != NOT_FOUND )
    {
        //scan month
        fValue[Month] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_D);
    if ( end != NOT_FOUND )
    {
        //scan day
        fValue[Day] = negate * parseInt(fStart,end);
        fStart = end+1;
        designator = true;
    }

    if ( (fEnd == XMLSize_t (endDate)) &&   // 'T' absent
         (fStart != fEnd)   )   // something after Day
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_inv_b4T
                , fBuffer
                , fMemoryManager);
    }

    if ( fEnd != XMLSize_t (endDate) ) // 'T' present
    {
        //scan hours, minutes, seconds
        //

        // skip 'T' first
        end = indexOf(++fStart, fEnd, DURATION_H);
        if ( end != NOT_FOUND )
        {
            //scan hours
            fValue[Hour] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_M);
        if ( end != NOT_FOUND )
        {
            //scan min
            fValue[Minute] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_S);
        if ( end != NOT_FOUND )
        {
            //scan seconds
            int mlsec = indexOf (fStart, end, MILISECOND_SEPARATOR);

            /***
             * Schema Errata: E2-23
             * at least one digit must follow the decimal point if it appears.
             * That is, the value of the seconds component must conform
             * to the following pattern: [0-9]+(.[0-9]+)?
             */
            if ( mlsec != NOT_FOUND )
            {
                /***
                 * make usure there is something after the '.' and before the end.
                 */
                if ( mlsec+1 == end )
                {
                    ThrowXMLwithMemMgr1(SchemaDateTimeException
                            , XMLExcepts::DateTime_dur_inv_seconds
                            , fBuffer
                            , fMemoryManager);
                }

                fValue[Second]     = negate * parseInt(fStart, mlsec);
                fMilliSecond        = negate * parseMiliSecond(mlsec+1, end);
            }
            else
            {
                fValue[Second] = negate * parseInt(fStart,end);
            }

            fStart = end+1;
            designator = true;
        }

        // no additional data should appear after last item
        // P1Y1M1DT is illigal value as well
        if ( (fStart != fEnd) ||
              fBuffer[--fStart] == DATETIME_SEPARATOR )
        {
            ThrowXMLwithMemMgr1(SchemaDateTimeException
                    , XMLExcepts::DateTime_dur_NoTimeAfterT
                    , fBuffer
                    , fMemoryManager);
        }
    }

    if ( !designator )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_NoElementAtAll
                , fBuffer
                , fMemoryManager);
    }

}